

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

uint32_t copysample(aec_stream_conflict *strm)

{
  uint32_t uVar1;
  aec_stream_conflict *in_RDI;
  uint32_t local_4;
  
  uVar1 = bits_ask(in_RDI,in_RDI->bits_per_sample);
  if ((uVar1 == 0) || (in_RDI->avail_out < (ulong)in_RDI->state->bytes_per_sample)) {
    local_4 = 0;
  }
  else {
    uVar1 = bits_get(in_RDI,in_RDI->bits_per_sample);
    put_sample(in_RDI,uVar1);
    bits_drop(in_RDI,in_RDI->bits_per_sample);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static inline uint32_t copysample(struct aec_stream *strm)
{
    if (bits_ask(strm, strm->bits_per_sample) == 0
        || strm->avail_out < strm->state->bytes_per_sample)
        return 0;

    put_sample(strm, bits_get(strm, strm->bits_per_sample));
    bits_drop(strm, strm->bits_per_sample);
    return 1;
}